

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint generateFixedDistanceTree(HuffmanTree_conflict *tree)

{
  uint *bitlen_00;
  uint *bitlen;
  uint error;
  uint i;
  HuffmanTree_conflict *tree_local;
  
  bitlen_00 = (uint *)lodepng_malloc(0x80);
  if (bitlen_00 == (uint *)0x0) {
    tree_local._4_4_ = 0x53;
  }
  else {
    for (bitlen._4_4_ = 0; bitlen._4_4_ != 0x20; bitlen._4_4_ = bitlen._4_4_ + 1) {
      bitlen_00[bitlen._4_4_] = 5;
    }
    tree_local._4_4_ = HuffmanTree_makeFromLengths(tree,bitlen_00,0x20,0xf);
    lodepng_free(bitlen_00);
  }
  return tree_local._4_4_;
}

Assistant:

static unsigned generateFixedDistanceTree(HuffmanTree* tree) {
  unsigned i, error = 0;
  unsigned* bitlen = (unsigned*)lodepng_malloc(NUM_DISTANCE_SYMBOLS * sizeof(unsigned));
  if(!bitlen) return 83; /*alloc fail*/

  /*there are 32 distance codes, but 30-31 are unused*/
  for(i = 0; i != NUM_DISTANCE_SYMBOLS; ++i) bitlen[i] = 5;
  error = HuffmanTree_makeFromLengths(tree, bitlen, NUM_DISTANCE_SYMBOLS, 15);

  lodepng_free(bitlen);
  return error;
}